

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O2

void iDynTree::XMLParser::XMLParserPimpl::parserCallbackEndTag
               (void *context,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  shared_ptr<iDynTree::XMLElement> element;
  string message;
  allocator<char> local_d9;
  __shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2> local_d8;
  string local_c8;
  __shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  lVar1 = *context;
  lVar3 = *(long *)(lVar1 + 0x130);
  if (lVar3 == *(long *)(lVar1 + 0x138)) {
    lVar3 = *(long *)(*(long *)(lVar1 + 0x148) + -8) + 0x200;
  }
  std::__shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d8,
             (__shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2> *)(lVar3 + -0x10));
  if (*(char *)(*context + 0x1a1) == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Content of tag: ",(allocator<char> *)&local_78);
    XMLElement::getParsedTextContent_abi_cxx11_(&local_c8,local_d8._M_ptr);
    std::operator+(&local_58,&local_98,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_98);
    iDynTree::reportInfo("XMLParser","parserCallbackEndTag",local_58._M_dataplus._M_p);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"End of tag <",&local_d9)
    ;
    XMLElement::name_abi_cxx11_(&local_38,local_d8._M_ptr);
    std::operator+(&local_c8,&local_78,&local_38);
    std::operator+(&local_98,&local_c8,">");
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    iDynTree::reportInfo("XMLParser","parserCallbackEndTag",local_58._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_58);
  }
  (*(local_d8._M_ptr)->_vptr_XMLElement[3])();
  std::
  deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ::pop_back((deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
              *)(*context + 0x100));
  lVar1 = *context;
  lVar3 = *(long *)(lVar1 + 0x130);
  if (lVar3 != *(long *)(lVar1 + 0x110)) {
    if (lVar3 == *(long *)(lVar1 + 0x138)) {
      lVar3 = *(long *)(*(long *)(lVar1 + 0x148) + -8) + 0x200;
    }
    plVar2 = *(long **)(lVar3 + -0x10);
    std::__shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a8,&local_d8);
    (**(code **)(*plVar2 + 0x20))(plVar2,&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
  return;
}

Assistant:

void XMLParser::XMLParserPimpl::parserCallbackEndTag(void* context,
                                                         const xmlChar * localname,
                                                         const xmlChar * prefix,
                                                         const xmlChar * URI)
    {
        // TODO: use the prefix and uri, or remove them from the parameters        
        XMLParser *state = static_cast<XMLParser*>(context);
        std::shared_ptr<XMLElement> element = state->m_pimpl->m_parsedTrace.top();

        if (state->m_pimpl->m_logParsing) {
            // Add here the optional text content
            std::string message = std::string("Content of tag: ") + element->getParsedTextContent();
            reportInfo("XMLParser", "parserCallbackEndTag", message.c_str());
            
            // TODO: reportXXX should either accept a format + var arguments or something else
            message = std::string("End of tag <") + element->name() + (">");
            reportInfo("XMLParser", "parserCallbackEndTag", message.c_str());
        }
        element->exitElementScope();
        state->m_pimpl->m_parsedTrace.pop();
        // Get a callback also to the parent, if any
        if (!state->m_pimpl->m_parsedTrace.empty()) {
            state->m_pimpl->m_parsedTrace.top()->childHasBeenParsed(element);
        }
    }